

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_compress_advanced_internal
                 (ZSTDMT_CCtx *mtctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,
                 ZSTD_CDict *cdict,ZSTD_CCtx_params params)

{
  void *__dest;
  ZSTDMT_seqPool *seqPool;
  ZSTD_CCtx *cctx;
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  void *pvVar3;
  size_t sVar4;
  ZSTD_frameParameters fParams;
  ZSTD_CCtx_params params_00;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  buffer_t *pbVar12;
  ZSTDMT_jobDescription *pZVar13;
  unsigned_long_long uVar14;
  long lVar15;
  size_t sVar16;
  ZSTD_CDict *pZVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ZSTD_CCtx_params *pZVar21;
  undefined8 *puVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  long lVar26;
  byte bVar27;
  buffer_t buf;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined1 auVar28 [12];
  undefined1 auVar29 [24];
  undefined1 in_stack_fffffffffffffe28 [128];
  undefined1 auVar30 [24];
  buffer_t dstAsBuffer;
  buffer_t dstBuffer;
  ZSTD_CCtx_params jobParams;
  
  bVar27 = 0;
  jobParams.fParams._0_8_ = params.fParams._0_8_;
  jobParams._40_8_ = params._40_8_;
  jobParams.srcSizeHint = params.srcSizeHint;
  jobParams.attachDictPref = params.attachDictPref;
  jobParams.targetCBlockSize = params.targetCBlockSize;
  jobParams.format = params.format;
  jobParams.cParams.windowLog = params.cParams.windowLog;
  jobParams.cParams.chainLog = params.cParams.chainLog;
  jobParams.cParams.hashLog = params.cParams.hashLog;
  jobParams.cParams.searchLog = params.cParams.searchLog;
  jobParams.cParams.minMatch = params.cParams.minMatch;
  jobParams.cParams.targetLength = params.cParams.targetLength;
  jobParams.cParams.strategy = params.cParams.strategy;
  jobParams._48_8_ = params._48_8_ & 0xffffffff00000000;
  jobParams.ldmParams.minMatchLength = 0;
  jobParams.ldmParams.hashRateLog = 0;
  jobParams._116_8_ = 0;
  jobParams.customMem._4_8_ = 0;
  jobParams.customMem._12_8_ = 0;
  jobParams.nbWorkers = 0;
  jobParams.jobSize._0_4_ = 0;
  jobParams._84_8_ = 0;
  jobParams.rsyncable = 0;
  jobParams.ldmParams.enableLdm = 0;
  jobParams.ldmParams.hashLog = 0;
  jobParams.ldmParams.bucketSizeLog = 0;
  jobParams.customMem.opaque._4_4_ = 0;
  jobParams.literalCompressionMode = params.literalCompressionMode;
  sVar8 = ZSTDMT_computeOverlapSize(&params);
  iVar7 = params.nbWorkers;
  uVar18 = (ulong)(uint)params.nbWorkers;
  if (uVar18 == 0) {
    __assert_fail("nbWorkers>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4f2f,
                  "unsigned int ZSTDMT_computeNbJobs(const ZSTD_CCtx_params *, size_t, unsigned int)"
                 );
  }
  uVar5 = ZSTDMT_computeTargetJobLog(&params);
  uVar6 = (int)(srcSize / (uVar18 << ((byte)uVar5 + 2 & 0x3f))) + 1;
  uVar5 = (int)(srcSize >> ((byte)uVar5 & 0x3f)) + 1;
  if ((uint)iVar7 <= uVar5) {
    uVar5 = iVar7;
  }
  if (1 < uVar6) {
    uVar5 = uVar6 * iVar7;
  }
  uVar23 = CONCAT44(0,uVar5);
  auVar28._8_4_ = 0;
  auVar28._0_8_ = uVar23;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = (uVar5 - 1) + srcSize;
  uVar9 = SUB128(auVar2 / auVar28,0);
  uVar18 = uVar9 + 0xffff;
  if (0x7ffe < (SUB124(auVar2 / auVar28,0) - 1U & 0x1ffff)) {
    uVar18 = uVar9;
  }
  uVar9 = (ulong)(0x20000U - (int)srcSize >> 0xb);
  if (0x1ffff < srcSize) {
    uVar9 = 0;
  }
  uVar10 = uVar23;
  if (dstCapacity < uVar9 + (srcSize >> 8) + srcSize) {
    uVar9 = (ulong)(0x20000U - (int)uVar18 >> 0xb);
    if (0x1ffff < uVar18) {
      uVar9 = 0;
    }
    uVar10 = dstCapacity / (uVar9 + (uVar18 >> 8) + uVar18);
  }
  if (mtctx->cctxPool->totalCCtx == iVar7) {
    params.jobSize = uVar18 & 0xffffffff;
    if ((iVar7 < 2) || (uVar5 == 1)) {
      cctx = mtctx->cctxPool->cctx[0];
      if (cdict == (ZSTD_CDict *)0x0) {
        sVar11 = ZSTD_compress_advanced_internal
                           (cctx,dst,dstCapacity,src,srcSize,(void *)0x0,0,&jobParams);
      }
      else {
        fParams.checksumFlag = params.fParams.checksumFlag;
        fParams.contentSizeFlag = params.fParams.contentSizeFlag;
        fParams.noDictIDFlag = params.fParams.noDictIDFlag;
        sVar11 = ZSTD_compress_usingCDict_advanced(cctx,dst,dstCapacity,src,srcSize,cdict,fParams);
      }
    }
    else {
      if (uVar18 < 0x40000) {
        __assert_fail("avgJobSize >= 256 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4f5b,
                      "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
                     );
      }
      ZSTDMT_setBufferSize(mtctx->bufPool,(uVar18 >> 8) + uVar18);
      seqPool = mtctx->seqPool;
      pZVar21 = &params;
      puVar22 = (undefined8 *)&stack0xfffffffffffffe18;
      for (lVar15 = 0x12; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar22 = *(undefined8 *)pZVar21;
        pZVar21 = (ZSTD_CCtx_params *)((long)pZVar21 + (ulong)bVar27 * -0x10 + 8);
        puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
      }
      params_00.cParams.chainLog = in_stack_fffffffffffffe20;
      params_00.format = (int)in_stack_fffffffffffffe18;
      params_00.cParams.windowLog = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
      params_00.cParams.hashLog = in_stack_fffffffffffffe24;
      auVar28 = in_stack_fffffffffffffe28._16_12_;
      auVar29 = in_stack_fffffffffffffe28._80_24_;
      auVar30 = in_stack_fffffffffffffe28._104_24_;
      params_00.cParams.searchLog = in_stack_fffffffffffffe28._0_4_;
      params_00.cParams.minMatch = in_stack_fffffffffffffe28._4_4_;
      params_00.cParams.targetLength = in_stack_fffffffffffffe28._8_4_;
      params_00.cParams.strategy = in_stack_fffffffffffffe28._12_4_;
      params_00.fParams.contentSizeFlag = auVar28._0_4_;
      params_00.fParams.checksumFlag = auVar28._4_4_;
      params_00.fParams.noDictIDFlag = auVar28._8_4_;
      params_00.compressionLevel = in_stack_fffffffffffffe28._28_4_;
      params_00.forceWindow = in_stack_fffffffffffffe28._32_4_;
      params_00._52_4_ = in_stack_fffffffffffffe28._36_4_;
      params_00.targetCBlockSize = in_stack_fffffffffffffe28._40_8_;
      params_00.srcSizeHint = in_stack_fffffffffffffe28._48_4_;
      params_00.attachDictPref = in_stack_fffffffffffffe28._52_4_;
      params_00.literalCompressionMode = in_stack_fffffffffffffe28._56_4_;
      params_00.nbWorkers = in_stack_fffffffffffffe28._60_4_;
      params_00.jobSize = in_stack_fffffffffffffe28._64_8_;
      params_00.overlapLog = in_stack_fffffffffffffe28._72_4_;
      params_00.rsyncable = in_stack_fffffffffffffe28._76_4_;
      params_00.ldmParams.enableLdm = auVar29._0_4_;
      params_00.ldmParams.hashLog = auVar29._4_4_;
      params_00.ldmParams.bucketSizeLog = auVar29._8_4_;
      params_00.ldmParams.minMatchLength = auVar29._12_4_;
      params_00.ldmParams.hashRateLog = auVar29._16_4_;
      params_00.ldmParams.windowLog = auVar29._20_4_;
      params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar30._0_8_;
      params_00.customMem.customFree = (ZSTD_freeFunction)auVar30._8_8_;
      params_00.customMem.opaque = (void *)auVar30._16_8_;
      iVar7 = ZSTDMT_serialState_reset(&mtctx->serial,seqPool,params_00,uVar18,(void *)0x0,0);
      if (iVar7 == 0) {
        sVar11 = ZSTDMT_expandJobsTable(mtctx,uVar5);
        if (sVar11 < 0xffffffffffffff89) {
          lVar19 = 0xbc;
          lVar15 = 0;
          lVar26 = 0;
          sVar11 = srcSize;
          for (uVar9 = 0; uVar23 != uVar9; uVar9 = uVar9 + 1) {
            uVar20 = uVar18;
            if (sVar11 < uVar18) {
              uVar20 = sVar11;
            }
            uVar24 = (ulong)(0x20000U - (int)uVar20 >> 0xb);
            if (0x1ffff < uVar20) {
              uVar24 = 0;
            }
            sVar25 = uVar24 + (uVar20 >> 8) + uVar20;
            dstAsBuffer.start = (void *)((long)dst + lVar15);
            pbVar12 = &g_nullBuffer;
            if (uVar9 < (uVar10 & 0xffffffff)) {
              pbVar12 = &dstAsBuffer;
            }
            dstAsBuffer.capacity = sVar25;
            pvVar3 = pbVar12->start;
            sVar4 = pbVar12->capacity;
            sVar16 = sVar8;
            if (uVar9 == 0) {
              sVar16 = 0;
            }
            pZVar13 = mtctx->jobs;
            *(size_t *)((long)pZVar13 + lVar19 + -0x24) = ((long)src + lVar26) - sVar16;
            *(size_t *)((long)pZVar13 + lVar19 + -0x1c) = sVar16;
            *(long *)((long)pZVar13 + lVar19 + -0x14) = (long)src + lVar26;
            *(ulong *)((long)pZVar13 + lVar19 + -0xc) = uVar20;
            if (sVar11 == 0) {
              __assert_fail("jobSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4f6d,
                            "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
                           );
            }
            pZVar17 = (ZSTD_CDict *)0x0;
            if (uVar9 == 0) {
              pZVar17 = cdict;
            }
            __dest = (void *)((long)&pZVar13->cSize + lVar19 + 4);
            *(undefined1 (*) [16])((long)__dest + -200) = ZEXT816(0) << 0x20;
            *(ZSTD_CDict **)((long)__dest + 0x90) = pZVar17;
            *(size_t *)((long)__dest + 0x98) = srcSize;
            memcpy(__dest,&jobParams,0x90);
            puVar22 = (undefined8 *)((long)mtctx->jobs + lVar19 + -0x34);
            *puVar22 = pvVar3;
            puVar22[1] = sVar4;
            pZVar13 = mtctx->jobs;
            auVar1._0_8_ = mtctx->bufPool;
            auVar1._8_8_ = mtctx->cctxPool;
            auVar1 = vpermilps_avx(auVar1,0x4e);
            *(undefined1 (*) [16])((long)pZVar13 + lVar19 + -0x54) = auVar1;
            *(ZSTDMT_seqPool **)((long)pZVar13 + lVar19 + -0x44) = mtctx->seqPool;
            *(serialState_t **)((long)pZVar13 + lVar19 + -0x3c) = &mtctx->serial;
            *(int *)((long)pZVar13 + lVar19 + -4) = (int)uVar9;
            auVar1 = vpinsrb_avx(ZEXT416((uint)CONCAT71((int7)(sVar16 >> 8),uVar9 == 0)),
                                 (int)CONCAT71((int7)(uVar9 >> 8),uVar5 - 1 == uVar9),8);
            auVar1 = vpshufd_avx(auVar1,0xe8);
            auVar1 = vpand_avx(auVar1,_DAT_001914e0);
            *(long *)((long)&pZVar13->consumed + lVar19) = auVar1._0_8_;
            POOL_add(mtctx->factory,ZSTDMT_compressionJob,(void *)(lVar19 + -0xbc + (long)pZVar13));
            lVar26 = lVar26 + uVar20;
            lVar15 = lVar15 + sVar25;
            sVar11 = sVar11 - uVar20;
            lVar19 = lVar19 + 0x178;
          }
          uVar18 = 0;
          sVar11 = 0;
          for (uVar9 = 0; uVar9 != uVar23; uVar9 = uVar9 + 1) {
            pthread_mutex_lock((pthread_mutex_t *)&mtctx->jobs[uVar9].job_mutex);
            while (pZVar13 = mtctx->jobs, pZVar13[uVar9].consumed < pZVar13[uVar9].src.size) {
              pthread_cond_wait((pthread_cond_t *)&pZVar13[uVar9].job_cond,
                                (pthread_mutex_t *)&pZVar13[uVar9].job_mutex);
            }
            pthread_mutex_unlock((pthread_mutex_t *)&pZVar13[uVar9].job_mutex);
            pZVar13 = mtctx->jobs;
            uVar20 = pZVar13[uVar9].cSize;
            uVar24 = uVar18;
            if (0xffffffffffffff88 < uVar20) {
              uVar24 = uVar20;
            }
            uVar18 = 0;
            if (dstCapacity < uVar20 + sVar11) {
              uVar18 = 0xffffffffffffffba;
            }
            if (uVar24 != 0) {
              uVar18 = uVar24;
            }
            if (uVar9 != 0) {
              if (uVar18 == 0) {
                memmove((void *)(sVar11 + (long)dst),pZVar13[uVar9].dstBuff.start,uVar20);
                pZVar13 = mtctx->jobs;
              }
              if ((uVar10 & 0xffffffff) <= uVar9) {
                buf.capacity = pZVar13[uVar9].dstBuff.capacity;
                buf.start = pZVar13[uVar9].dstBuff.start;
                ZSTDMT_releaseBuffer(mtctx->bufPool,buf);
                pZVar13 = mtctx->jobs;
              }
            }
            pZVar13[uVar9].dstBuff.start = (void *)0x0;
            pZVar13[uVar9].dstBuff.capacity = 0;
            mtctx->jobs[uVar9].cSize = 0;
            sVar11 = uVar20 + sVar11;
          }
          if (params.fParams.checksumFlag != 0) {
            if (dstCapacity < sVar11 + 4) {
              return 0xffffffffffffffba;
            }
            uVar14 = ZSTD_XXH64_digest(&(mtctx->serial).xxhState);
            *(int *)((long)dst + sVar11) = (int)uVar14;
            sVar11 = sVar11 + 4;
          }
          if (uVar18 != 0) {
            sVar11 = uVar18;
          }
        }
      }
      else {
        sVar11 = 0xffffffffffffffc0;
      }
    }
    return sVar11;
  }
  __assert_fail("mtctx->cctxPool->totalCCtx == params.nbWorkers",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x4f4e,
                "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
               );
}

Assistant:

static size_t ZSTDMT_compress_advanced_internal(
                ZSTDMT_CCtx* mtctx,
                void* dst, size_t dstCapacity,
          const void* src, size_t srcSize,
          const ZSTD_CDict* cdict,
                ZSTD_CCtx_params params)
{
    ZSTD_CCtx_params const jobParams = ZSTDMT_initJobCCtxParams(&params);
    size_t const overlapSize = ZSTDMT_computeOverlapSize(&params);
    unsigned const nbJobs = ZSTDMT_computeNbJobs(&params, srcSize, params.nbWorkers);
    size_t const proposedJobSize = (srcSize + (nbJobs-1)) / nbJobs;
    size_t const avgJobSize = (((proposedJobSize-1) & 0x1FFFF) < 0x7FFF) ? proposedJobSize + 0xFFFF : proposedJobSize;   /* avoid too small last block */
    const char* const srcStart = (const char*)src;
    size_t remainingSrcSize = srcSize;
    unsigned const compressWithinDst = (dstCapacity >= ZSTD_compressBound(srcSize)) ? nbJobs : (unsigned)(dstCapacity / ZSTD_compressBound(avgJobSize));  /* presumes avgJobSize >= 256 KB, which should be the case */
    size_t frameStartPos = 0, dstBufferPos = 0;
    assert(jobParams.nbWorkers == 0);
    assert(mtctx->cctxPool->totalCCtx == params.nbWorkers);

    params.jobSize = (U32)avgJobSize;
    DEBUGLOG(4, "ZSTDMT_compress_advanced_internal: nbJobs=%2u (rawSize=%u bytes; fixedSize=%u) ",
                nbJobs, (U32)proposedJobSize, (U32)avgJobSize);

    if ((nbJobs==1) | (params.nbWorkers<=1)) {   /* fallback to single-thread mode : this is a blocking invocation anyway */
        ZSTD_CCtx* const cctx = mtctx->cctxPool->cctx[0];
        DEBUGLOG(4, "ZSTDMT_compress_advanced_internal: fallback to single-thread mode");
        if (cdict) return ZSTD_compress_usingCDict_advanced(cctx, dst, dstCapacity, src, srcSize, cdict, jobParams.fParams);
        return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, NULL, 0, &jobParams);
    }

    assert(avgJobSize >= 256 KB);  /* condition for ZSTD_compressBound(A) + ZSTD_compressBound(B) <= ZSTD_compressBound(A+B), required to compress directly into Dst (no additional buffer) */
    ZSTDMT_setBufferSize(mtctx->bufPool, ZSTD_compressBound(avgJobSize) );
    if (ZSTDMT_serialState_reset(&mtctx->serial, mtctx->seqPool, params, avgJobSize, NULL, 0))
        return ERROR(memory_allocation);

    FORWARD_IF_ERROR( ZSTDMT_expandJobsTable(mtctx, nbJobs) );  /* only expands if necessary */

    {   unsigned u;
        for (u=0; u<nbJobs; u++) {
            size_t const jobSize = MIN(remainingSrcSize, avgJobSize);
            size_t const dstBufferCapacity = ZSTD_compressBound(jobSize);
            buffer_t const dstAsBuffer = { (char*)dst + dstBufferPos, dstBufferCapacity };
            buffer_t const dstBuffer = u < compressWithinDst ? dstAsBuffer : g_nullBuffer;
            size_t dictSize = u ? overlapSize : 0;

            mtctx->jobs[u].prefix.start = srcStart + frameStartPos - dictSize;
            mtctx->jobs[u].prefix.size = dictSize;
            mtctx->jobs[u].src.start = srcStart + frameStartPos;
            mtctx->jobs[u].src.size = jobSize; assert(jobSize > 0);  /* avoid job.src.size == 0 */
            mtctx->jobs[u].consumed = 0;
            mtctx->jobs[u].cSize = 0;
            mtctx->jobs[u].cdict = (u==0) ? cdict : NULL;
            mtctx->jobs[u].fullFrameSize = srcSize;
            mtctx->jobs[u].params = jobParams;
            /* do not calculate checksum within sections, but write it in header for first section */
            mtctx->jobs[u].dstBuff = dstBuffer;
            mtctx->jobs[u].cctxPool = mtctx->cctxPool;
            mtctx->jobs[u].bufPool = mtctx->bufPool;
            mtctx->jobs[u].seqPool = mtctx->seqPool;
            mtctx->jobs[u].serial = &mtctx->serial;
            mtctx->jobs[u].jobID = u;
            mtctx->jobs[u].firstJob = (u==0);
            mtctx->jobs[u].lastJob = (u==nbJobs-1);

            DEBUGLOG(5, "ZSTDMT_compress_advanced_internal: posting job %u  (%u bytes)", u, (U32)jobSize);
            DEBUG_PRINTHEX(6, mtctx->jobs[u].prefix.start, 12);
            POOL_add(mtctx->factory, ZSTDMT_compressionJob, &mtctx->jobs[u]);

            frameStartPos += jobSize;
            dstBufferPos += dstBufferCapacity;
            remainingSrcSize -= jobSize;
    }   }

    /* collect result */
    {   size_t error = 0, dstPos = 0;
        unsigned jobID;
        for (jobID=0; jobID<nbJobs; jobID++) {
            DEBUGLOG(5, "waiting for job %u ", jobID);
            ZSTD_PTHREAD_MUTEX_LOCK(&mtctx->jobs[jobID].job_mutex);
            while (mtctx->jobs[jobID].consumed < mtctx->jobs[jobID].src.size) {
                DEBUGLOG(5, "waiting for jobCompleted signal from job %u", jobID);
                ZSTD_pthread_cond_wait(&mtctx->jobs[jobID].job_cond, &mtctx->jobs[jobID].job_mutex);
            }
            ZSTD_pthread_mutex_unlock(&mtctx->jobs[jobID].job_mutex);
            DEBUGLOG(5, "ready to write job %u ", jobID);

            {   size_t const cSize = mtctx->jobs[jobID].cSize;
                if (ZSTD_isError(cSize)) error = cSize;
                if ((!error) && (dstPos + cSize > dstCapacity)) error = ERROR(dstSize_tooSmall);
                if (jobID) {   /* note : job 0 is written directly at dst, which is correct position */
                    if (!error)
                        memmove((char*)dst + dstPos, mtctx->jobs[jobID].dstBuff.start, cSize);  /* may overlap when job compressed within dst */
                    if (jobID >= compressWithinDst) {  /* job compressed into its own buffer, which must be released */
                        DEBUGLOG(5, "releasing buffer %u>=%u", jobID, compressWithinDst);
                        ZSTDMT_releaseBuffer(mtctx->bufPool, mtctx->jobs[jobID].dstBuff);
                }   }
                mtctx->jobs[jobID].dstBuff = g_nullBuffer;
                mtctx->jobs[jobID].cSize = 0;
                dstPos += cSize ;
            }
        }  /* for (jobID=0; jobID<nbJobs; jobID++) */

        DEBUGLOG(4, "checksumFlag : %u ", params.fParams.checksumFlag);
        if (params.fParams.checksumFlag) {
            U32 const checksum = (U32)XXH64_digest(&mtctx->serial.xxhState);
            if (dstPos + 4 > dstCapacity) {
                error = ERROR(dstSize_tooSmall);
            } else {
                DEBUGLOG(4, "writing checksum : %08X \n", checksum);
                MEM_writeLE32((char*)dst + dstPos, checksum);
                dstPos += 4;
        }   }

        if (!error) DEBUGLOG(4, "compressed size : %u  ", (U32)dstPos);
        return error ? error : dstPos;
    }
}